

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_details.hpp
# Opt level: O2

int __thiscall
so_5::mchain_props::
mchain_template<so_5::mchain_props::details::limited_dynamic_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
::close(mchain_template<so_5::mchain_props::details::limited_dynamic_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
        *this,int __fd)

{
  limited_dynamic_demand_queue *this_00;
  bool bVar1;
  int iVar2;
  demand_t *d;
  
  std::mutex::lock(&this->m_lock);
  if (this->m_status == closed) goto LAB_0025251f;
  this_00 = &this->m_queue;
  this->m_status = closed;
  bVar1 = details::limited_dynamic_demand_queue::is_full(this_00);
  if (__fd == 0) {
    while ((this->m_queue).m_queue.
           super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
           (this->m_queue).m_queue.
           super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      d = details::limited_dynamic_demand_queue::front(this_00);
      impl::msg_tracing_helpers::mchain_tracing_enabled_base::trace_demand_drop_on_close
                (&this->super_mchain_tracing_enabled_base,&this->super_abstract_message_chain_t,d);
      details::limited_dynamic_demand_queue::pop_front(this_00);
    }
LAB_002524ed:
    notify_multi_chain_select_ops(this);
  }
  else if ((this->m_queue).m_queue.
           super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
           (this->m_queue).m_queue.
           super__Deque_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_002524ed;
  if (this->m_threads_to_wakeup != 0) {
    std::condition_variable::notify_all();
  }
  if (bVar1) {
    std::condition_variable::notify_all();
  }
LAB_0025251f:
  iVar2 = pthread_mutex_unlock((pthread_mutex_t *)&this->m_lock);
  return iVar2;
}

Assistant:

virtual void
		close( close_mode_t mode ) override
			{
				std::lock_guard< std::mutex > lock{ m_lock };

				if( details::status::closed == m_status )
					return;

				m_status = details::status::closed;

				const bool was_full = m_queue.is_full();

				if( close_mode_t::drop_content == mode )
					{
						while( !m_queue.is_empty() )
							{
								this->trace_demand_drop_on_close(
										*this, m_queue.front() );
								m_queue.pop_front();
							}
					}

				// If queue is empty now and there is any multi chain select
				// than select_tail must be handled.
				if( m_queue.is_empty() )
					notify_multi_chain_select_ops();

				if( m_threads_to_wakeup )
					// Someone is waiting on empty chain for new messages.
					// It must be informed that no new messages will be here.
					m_underflow_cond.notify_all();

				if( was_full )
					// Someone can wait on full chain for free place for new message.
					// It must be informed that the chain is closed.
					m_overflow_cond.notify_all();
			}